

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsEllipseItem::QGraphicsEllipseItem
          (QGraphicsEllipseItem *this,QRectF *rect,QGraphicsItem *parent)

{
  QGraphicsEllipseItemPrivate *this_00;
  
  this_00 = (QGraphicsEllipseItemPrivate *)operator_new(0x1d0);
  QGraphicsEllipseItemPrivate::QGraphicsEllipseItemPrivate(this_00);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
            (&this->super_QAbstractGraphicsShapeItem,(QAbstractGraphicsShapeItemPrivate *)this_00,
             parent);
  (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem =
       (_func_int **)&PTR__QGraphicsPixmapItem_007ebac8;
  setRect(this,rect);
  return;
}

Assistant:

QGraphicsEllipseItem::QGraphicsEllipseItem(const QRectF &rect, QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsEllipseItemPrivate, parent)
{
    setRect(rect);
}